

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

uint __thiscall CVmObjBigNum::calc_hash(CVmObjBigNum *this,vm_obj_id_t self,int param_3)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  long in_RDI;
  uint hash;
  uint i;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = 0;
  local_14 = 0;
  while( true ) {
    sVar3 = get_prec((char *)0x2bb201);
    if (sVar3 <= local_14) break;
    uVar1 = get_dig(*(char **)(in_RDI + 8),(ulong)local_14);
    local_18 = uVar1 + local_18;
    local_14 = local_14 + 1;
  }
  iVar2 = get_exp((char *)0x2bb244);
  return iVar2 + local_18;
}

Assistant:

uint CVmObjBigNum::calc_hash(VMG_ vm_obj_id_t self, int /*depth*/) const
{
    uint i;
    uint hash;

    /* add up the digits in the number */
    for (hash = 0, i = 0 ; i < get_prec(ext_) ; ++i)
    {
        /* add this digit into the hash so far */
        hash += get_dig(ext_, i);
    }

    /* add in the exponent as well */
    hash += (uint)get_exp(ext_);

    /* return the combined hash */
    return hash;
}